

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall dd::ProcessThreadImpl::Start(ProcessThreadImpl *this)

{
  char *__s;
  bool bVar1;
  pointer pPVar2;
  PlatformThread *this_00;
  allocator<char> local_51;
  string local_50;
  reference local_30;
  ModuleCallback *m;
  iterator __end1;
  iterator __begin1;
  ModuleList *__range1;
  ProcessThreadImpl *this_local;
  
  bVar1 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (!bVar1) {
    __assert_fail("_thread_checker.IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x2e,"virtual void dd::ProcessThreadImpl::Start()");
  }
  pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::get
                     (&this->_thread);
  if (pPVar2 == (pointer)0x0) {
    pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::get
                       (&this->_thread);
    if (pPVar2 == (pointer)0x0) {
      if (((this->_stop ^ 0xffU) & 1) == 0) {
        __assert_fail("!_stop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                      ,0x32,"virtual void dd::ProcessThreadImpl::Start()");
      }
      __end1 = std::__cxx11::
               list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
               ::begin(&this->_modules);
      m = (ModuleCallback *)
          std::__cxx11::
          list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
          ::end(&this->_modules);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&m), bVar1) {
        local_30 = std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator*(&__end1);
        (*local_30->module->_vptr_Module[2])(local_30->module,this);
        std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator++(&__end1);
      }
      this_00 = (PlatformThread *)operator_new(0xd8);
      __s = this->_thread_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
      PlatformThread::PlatformThread(this_00,Run,this,&local_50,kNormalPriority);
      std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::reset
                (&this->_thread,this_00);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::
               operator->(&this->_thread);
      PlatformThread::Start(pPVar2);
    }
    return;
  }
  __assert_fail("!_thread.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x2f,"virtual void dd::ProcessThreadImpl::Start()");
}

Assistant:

void ProcessThreadImpl::Start() {
		assert(_thread_checker.IsCurrent());
		assert(!_thread.get());
		if (_thread.get())
			return;
		assert(!_stop);

		for (ModuleCallback& m : _modules)
			m.module->ProcessThreadAttached(this);

		_thread.reset(new PlatformThread(&ProcessThreadImpl::Run, this, _thread_name));
		_thread->Start();
	}